

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringReader.hpp
# Opt level: O0

void __thiscall StringReader::~StringReader(StringReader *this)

{
  StringReader *this_local;
  
  ~StringReader(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~StringReader() override = default;